

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O2

HRESULT utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCWSTR sourceString,size_t sourceCount,
                  LPSTR *destStringPtr,size_t *destCount,size_t *allocateCount)

{
  size_t cbDest;
  code *pcVar1;
  utf8char_t *dest;
  size_t sVar2;
  PAL_FILE *pPVar3;
  HRESULT HVar4;
  
  HVar4 = -0x7ff8fff2;
  if (sourceCount < 0xffffffff) {
    cbDest = sourceCount * 3 + 1;
    dest = (utf8char_t *)(*allocator)(cbDest);
    if (dest != (utf8char_t *)0x0) {
      sVar2 = EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                        (dest,cbDest,sourceString,(charcount_t)sourceCount);
      if (cbDest < sVar2) {
        pPVar3 = PAL_get_stderr(0);
        PAL_fprintf(pPVar3,"ASSERTION (%s, line %d) %s %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                    ,0x33,"cbEncoded <= cbDestString","cbEncoded <= cbDestString");
        pPVar3 = PAL_get_stderr(0);
        PAL_fflush(pPVar3);
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *destStringPtr = (LPSTR)dest;
      *destCount = sVar2;
      HVar4 = 0;
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = sVar2;
        HVar4 = 0;
      }
    }
  }
  return HVar4;
}

Assistant:

HRESULT WideStringToNarrow(
        _In_ AllocatorFunction allocator,
        _In_ LPCWSTR sourceString,
        size_t sourceCount,
        _Out_ LPSTR* destStringPtr,
        _Out_ size_t* destCount,
        size_t* allocateCount = nullptr)
    {
        size_t cchSourceString = sourceCount;

        if (cchSourceString >= MAXUINT32)
        {
            return E_OUTOFMEMORY;
        }

        // Multiply by 3 for max size of encoded character, plus 1 for the null terminator (don't need 3 bytes for the null terminator)
        size_t cbDestString = (cchSourceString * 3) + 1;

        // Check for overflow- cbDestString should be >= cchSourceString
        if (cbDestString < cchSourceString)
        {
            return E_OUTOFMEMORY;
        }

        utf8char_t* destString = (utf8char_t*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        size_t cbEncoded = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::TrueUtf8>(destString, cbDestString, sourceString, static_cast<charcount_t>(cchSourceString));
        Assert(cbEncoded <= cbDestString);
        static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
        *destStringPtr = (char*)destString;
        *destCount = cbEncoded;
        if (allocateCount != nullptr)
        {
            *allocateCount = cbEncoded;
        }

        return S_OK;
    }